

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

void yyPush(GREG *G,char *text,int count,yythunk *thunk,void *yyxvar)

{
  ulong uVar1;
  int *piVar2;
  size_t off;
  void *yyxvar_local;
  yythunk *thunk_local;
  int count_local;
  char *text_local;
  GREG *G_local;
  
  uVar1 = ((long)G->val - (long)G->vals >> 2) + (long)count;
  if ((ulong)(long)G->valslen < uVar1) {
    while ((ulong)(long)G->valslen < uVar1 + 1) {
      G->valslen = G->valslen << 1;
    }
    piVar2 = (int *)realloc(G->vals,(long)G->valslen << 2);
    G->vals = piVar2;
    G->val = G->vals + uVar1;
  }
  else {
    G->val = G->val + count;
  }
  return;
}

Assistant:

YY_LOCAL(void) yyPush(GREG *G, char *text, int count, yythunk *thunk, YY_XTYPE YY_XVAR)	{
  size_t off = (G->val - G->vals) + count;
  if (off > G->valslen) {
    while (G->valslen < off + 1)
      G->valslen *= 2;
    G->vals= (YYSTYPE*)YY_REALLOC((void *)G->vals, sizeof(YYSTYPE) * G->valslen, G->data);
    G->val= G->vals + off;
  } else {
    G->val += count;
  }
}